

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_uint_vector.h
# Opt level: O0

void __thiscall
s2coding::EncodeUintVector<unsigned_int>(s2coding *this,Span<const_unsigned_int> v,Encoder *encoder)

{
  Encoder *this_00;
  int iVar1;
  ostream *poVar2;
  size_type sVar3;
  iterator puVar4;
  uint x_1;
  iterator __end0_1;
  iterator __begin0_1;
  Span<const_unsigned_int> *__range2_1;
  uint64 size_len;
  S2LogMessage local_60;
  S2LogMessageVoidify local_49;
  int local_48;
  uint local_44;
  int len;
  uint x;
  iterator __end0;
  iterator __begin0;
  Span<const_unsigned_int> *__range2;
  Encoder *pEStack_20;
  uint one_bits;
  Encoder *encoder_local;
  Span<const_unsigned_int> v_local;
  
  pEStack_20 = (Encoder *)v.len_;
  v_local.ptr_ = v.ptr_;
  __range2._4_4_ = 1;
  __begin0 = (iterator)&encoder_local;
  encoder_local = (Encoder *)this;
  __end0 = absl::Span<const_unsigned_int>::begin((Span<const_unsigned_int> *)__begin0);
  _len = absl::Span<const_unsigned_int>::end((Span<const_unsigned_int> *)__begin0);
  for (; __end0 != _len; __end0 = __end0 + 1) {
    local_44 = *__end0;
    __range2._4_4_ = local_44 | __range2._4_4_;
  }
  iVar1 = Bits::FindMSBSetNonZero64((ulong)__range2._4_4_);
  this_00 = pEStack_20;
  local_48 = (iVar1 >> 3) + 1;
  if (0 < local_48 && local_48 < 9) {
    sVar3 = absl::Span<const_unsigned_int>::size((Span<const_unsigned_int> *)&encoder_local);
    Encoder::Ensure(this_00,sVar3 * (long)local_48 + 10);
    sVar3 = absl::Span<const_unsigned_int>::size((Span<const_unsigned_int> *)&encoder_local);
    Encoder::put_varint64(pEStack_20,sVar3 << 2 | (long)(local_48 + -1));
    __end0_1 = absl::Span<const_unsigned_int>::begin((Span<const_unsigned_int> *)&encoder_local);
    puVar4 = absl::Span<const_unsigned_int>::end((Span<const_unsigned_int> *)&encoder_local);
    for (; __end0_1 != puVar4; __end0_1 = __end0_1 + 1) {
      EncodeUintWithLength<unsigned_int>(*__end0_1,local_48,pEStack_20);
    }
    return;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_uint_vector.h"
             ,0xd0,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_60);
  poVar2 = std::operator<<(poVar2,"Check failed: len >= 1 && len <= 8 ");
  S2LogMessageVoidify::operator&(&local_49,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_60);
}

Assistant:

void EncodeUintVector(absl::Span<const T> v, Encoder* encoder) {
  // The encoding is as follows:
  //
  //   varint64: (v.size() * sizeof(T)) | (len - 1)
  //   array of v.size() elements ["len" bytes each]
  //
  // Note that we don't allow (len == 0) since this would require an extra bit
  // to encode the length.

  T one_bits = 1;  // Ensures len >= 1.
  for (auto x : v) one_bits |= x;
  int len = (Bits::FindMSBSetNonZero64(one_bits) >> 3) + 1;
  S2_DCHECK(len >= 1 && len <= 8);

  // Note that the multiplication is optimized into a bit shift.
  encoder->Ensure(Varint::kMax64 + v.size() * len);
  uint64 size_len = (uint64{v.size()} * sizeof(T)) | (len - 1);
  encoder->put_varint64(size_len);
  for (auto x : v) {
    EncodeUintWithLength(x, len, encoder);
  }
}